

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O0

expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::Stage::GetPrimAtPath_abi_cxx11_
          (expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Stage *this,Path *path)

{
  value_type pPVar1;
  bool bVar2;
  pointer ppVar3;
  storage_t<const_tinyusdz::Prim_*> parent_00;
  value_type *ppPVar4;
  string *psVar5;
  mapped_type *ppPVar6;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>
  *value;
  string local_130;
  string local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [32];
  undefined1 local_d0 [40];
  string local_a8;
  optional<const_tinyusdz::Prim_*> local_88;
  undefined1 local_78 [8];
  optional<const_tinyusdz::Prim_*> pv;
  Prim *parent;
  const_iterator __end1;
  const_iterator __begin1;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *__range1;
  _Self local_40;
  iterator ret;
  unexpected_type<const_char_*> local_30;
  unexpected_type<const_char_*> local_28 [2];
  Path *path_local;
  Stage *this_local;
  
  local_28[1].m_error = (error_type)path;
  path_local = (Path *)this;
  this_local = (Stage *)__return_storage_ptr__;
  bVar2 = Path::is_valid(path);
  if (bVar2) {
    bVar2 = Path::is_relative_path((Path *)local_28[1].m_error);
    if (bVar2) {
      local_30 = nonstd::expected_lite::make_unexpected<char_const(&)[24]>
                           ((char (*) [24])"Relative path is TODO.\n");
      nonstd::expected_lite::
      expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<const_char_*,_0>(__return_storage_ptr__,&local_30);
    }
    else {
      bVar2 = Path::is_absolute_path((Path *)local_28[1].m_error);
      if (bVar2) {
        if ((this->_dirty & 1U) == 0) {
          psVar5 = Path::prim_part_abi_cxx11_((Path *)local_28[1].m_error);
          local_40._M_node =
               (_Base_ptr)
               ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
               ::find(&this->_prim_path_cache,psVar5);
          __range1 = (vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)
                     ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                     ::end(&this->_prim_path_cache);
          bVar2 = ::std::operator!=(&local_40,(_Self *)&__range1);
          if (bVar2) {
            ppVar3 = ::std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>
                     ::operator->(&local_40);
            nonstd::expected_lite::
            expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::expected<const_tinyusdz::Prim_*&,_0>(__return_storage_ptr__,&ppVar3->second);
            return __return_storage_ptr__;
          }
        }
        else {
          ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
          ::clear(&this->_prim_path_cache);
          this->_dirty = false;
        }
        __end1._M_current =
             (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::begin
                               ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)this);
        parent = (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end
                                   ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)this)
        ;
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end1,(__normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                                           *)&parent), bVar2) {
          parent_00 = (storage_t<const_tinyusdz::Prim_*>)
                      __gnu_cxx::
                      __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                      ::operator*(&__end1);
          pv.contained = parent_00;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_a8,"",(allocator *)(local_d0 + 0x27));
          anon_unknown_28::GetPrimAtPathRec
                    (&local_88,(Prim *)parent_00,&local_a8,(Path *)local_28[1].m_error,0);
          nonstd::optional_lite::optional<const_tinyusdz::Prim_*>::
          optional<const_tinyusdz::Prim_*,_0>
                    ((optional<const_tinyusdz::Prim_*> *)local_78,&local_88);
          nonstd::optional_lite::optional<const_tinyusdz::Prim_*>::~optional(&local_88);
          ::std::__cxx11::string::~string((string *)&local_a8);
          ::std::allocator<char>::~allocator((allocator<char> *)(local_d0 + 0x27));
          bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_78);
          if (bVar2) {
            ppPVar4 = nonstd::optional_lite::optional<const_tinyusdz::Prim_*>::value
                                ((optional<const_tinyusdz::Prim_*> *)local_78);
            pPVar1 = *ppPVar4;
            psVar5 = Path::prim_part_abi_cxx11_((Path *)local_28[1].m_error);
            ppPVar6 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                      ::operator[](&this->_prim_path_cache,psVar5);
            *ppPVar6 = pPVar1;
            ppPVar4 = nonstd::optional_lite::optional<const_tinyusdz::Prim_*>::value
                                ((optional<const_tinyusdz::Prim_*> *)local_78);
            nonstd::expected_lite::
            expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::expected<const_tinyusdz::Prim_*&,_0>(__return_storage_ptr__,ppPVar4);
          }
          local_d0._33_3_ = 0;
          local_d0[0x20] = bVar2;
          nonstd::optional_lite::optional<const_tinyusdz::Prim_*>::~optional
                    ((optional<const_tinyusdz::Prim_*> *)local_78);
          if (local_d0._32_4_ != 0) {
            return __return_storage_ptr__;
          }
          __gnu_cxx::
          __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
          ::operator++(&__end1);
        }
        Path::full_path_name_abi_cxx11_(&local_130,(Path *)local_28[1].m_error);
        ::std::operator+((char *)local_110,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Cannot find path <");
        ::std::operator+(local_f0,(char *)local_110);
        nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                  ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_d0,(expected_lite *)local_f0,value);
        nonstd::expected_lite::
        expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (__return_storage_ptr__,
                   (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_conflict1
                    *)local_d0);
        nonstd::expected_lite::
        unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_d0);
        ::std::__cxx11::string::~string((string *)local_f0);
        ::std::__cxx11::string::~string(local_110);
        ::std::__cxx11::string::~string((string *)&local_130);
      }
      else {
        ret._M_node = (_Base_ptr)
                      nonstd::expected_lite::make_unexpected<char_const(&)[50]>
                                ((char (*) [50])"Path is not absolute. Non-absolute Path is TODO.\n"
                                );
        nonstd::expected_lite::
        expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)&ret);
      }
    }
  }
  else {
    local_28[0] = nonstd::expected_lite::make_unexpected<char_const(&)[18]>
                            ((char (*) [18])"Path is invalid.\n");
    nonstd::expected_lite::
    expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<const Prim *, std::string> Stage::GetPrimAtPath(
    const Path &path) const {
  DCOUT("GetPrimAtPath : " << path.prim_part() << "(input path: " << path
                           << ")");

  if (!path.is_valid()) {
    DCOUT("Invalid path.");
    return nonstd::make_unexpected("Path is invalid.\n");
  }

  if (path.is_relative_path()) {
    DCOUT("Relative path is todo.");
    // TODO:
    return nonstd::make_unexpected("Relative path is TODO.\n");
  }

  if (!path.is_absolute_path()) {
    DCOUT("Not absolute path.");
    return nonstd::make_unexpected(
        "Path is not absolute. Non-absolute Path is TODO.\n");
  }

  if (_dirty) {
    DCOUT("clear cache.");
    // Clear cache.
    _prim_path_cache.clear();

    _dirty = false;
  } else {
    // First find from a cache.
    auto ret = _prim_path_cache.find(path.prim_part());
    if (ret != _prim_path_cache.end()) {
      DCOUT("Found cache.");
      return ret->second;
    }
  }


  // Brute-force search.
  for (const auto &parent : _root_nodes) {
    if (auto pv =
            GetPrimAtPathRec(&parent, /* root */ "", path, /* depth */ 0)) {
      // Add to cache.
      // Assume pointer address does not change unless dirty state.
      _prim_path_cache[path.prim_part()] = pv.value();
      return pv.value();
    }
  }

  DCOUT("Not found.");
  return nonstd::make_unexpected("Cannot find path <" + path.full_path_name() +
                                 "> in the Stage.\n");
}